

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenterCmd.cpp
# Opt level: O0

int cmdline_parser_configfile
              (char *filename,gengetopt_args_info *args_info,int override,int initialize,
              int check_required)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined4 in_R8D;
  cmdline_parser_params params;
  
  iVar1 = cmdline_parser_config_file
                    (in_RSI,(gengetopt_args_info *)CONCAT44(in_EDX,in_ECX),
                     (cmdline_parser_params *)CONCAT44(in_R8D,1));
  return iVar1;
}

Assistant:

int
cmdline_parser_configfile (
  const char *filename,
                           struct gengetopt_args_info *args_info,
                           int override, int initialize, int check_required)
{
  struct cmdline_parser_params params;

  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;
  
  return cmdline_parser_config_file (filename, args_info, &params);
}